

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

void VIRTUALCleanup(void)

{
  _CMI *p_Var1;
  CPalThread *pThread;
  CPalThread *pthrCurrent;
  PCMI pTempEntry;
  PCMI pEntry;
  
  pThread = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
  pTempEntry = pVirtualMemory;
  while( true ) {
    if (pTempEntry == (PCMI)0x0) {
      pVirtualMemory = (PCMI)0x0;
      pVirtualMemoryLastFound = (PCMI)0x0;
      CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      DeleteCriticalSection(&virtual_critsec);
      return;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) break;
    CorUnix::InternalFree(pTempEntry->pAllocState);
    CorUnix::InternalFree(pTempEntry->pProtectionState);
    p_Var1 = pTempEntry->pNext;
    CorUnix::InternalFree(pTempEntry);
    pTempEntry = p_Var1;
  }
  abort();
}

Assistant:

void VIRTUALCleanup()
{
    PCMI pEntry;
    PCMI pTempEntry;
#if MMAP_IGNORES_HINT
    FREE_BLOCK *pFreeBlock;
    FREE_BLOCK *pTempFreeBlock;
#endif  // MMAP_IGNORES_HINT
    CPalThread * pthrCurrent = InternalGetCurrentThread();

    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    // Clean up the allocated memory.
    pEntry = pVirtualMemory;
    while ( pEntry )
    {
        WARN( "The memory at %d was not freed through a call to VirtualFree.\n",
              pEntry->startBoundary );
        InternalFree(pEntry->pAllocState);
        InternalFree(pEntry->pProtectionState );
#if MMAP_DOESNOT_ALLOW_REMAP
        InternalFree(pEntry->pDirtyPages );
#endif
        pTempEntry = pEntry;
        pEntry = pEntry->pNext;
        InternalFree(pTempEntry );
    }
    pVirtualMemory = NULL;
    pVirtualMemoryLastFound = NULL;

#if MMAP_IGNORES_HINT
    // Clean up the free list.
    pFreeBlock = pFreeMemory;
    while (pFreeBlock != NULL)
    {
        // Ignore errors from munmap. There's nothing we'd really want to
        // do about them.
        munmap(pFreeBlock->startBoundary, pFreeBlock->memSize);
        pTempFreeBlock = pFreeBlock;
        pFreeBlock = pFreeBlock->next;
        InternalFree(pTempFreeBlock);
    }
    pFreeMemory = NULL;
    gBackingBaseAddress = MAP_FAILED;
#endif  // MMAP_IGNORES_HINT

#if RESERVE_FROM_BACKING_FILE
    if (gBackingFile != -1)
    {
        close(gBackingFile);
        gBackingFile = -1;
    }
#endif  // RESERVE_FROM_BACKING_FILE

    InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);

    TRACE( "Deleting the Virtual Critical Sections. \n" );
    DeleteCriticalSection( &virtual_critsec );
}